

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O2

int run_test_random_sync(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_210;
  char buf [256];
  char zero [256];
  
  iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,buf,0x100,0xffffffff,(uv_random_cb)0x0);
  if (iVar1 == -0x16) {
    iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,buf,0xffffffffffffffff,0xffffffff,
                      (uv_random_cb)0x0);
    if (iVar1 == -7) {
      memset(buf,0,0x100);
      iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,buf,0x100,0,(uv_random_cb)0x0);
      if (iVar1 == 0) {
        memset(zero,0,0x100);
        iVar1 = bcmp(buf,zero,0x100);
        if (iVar1 == 0) {
          pcVar3 = "0 != memcmp(buf, zero, sizeof(zero))";
          uStack_210 = 0x5a;
        }
        else {
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
          uStack_210 = 0x5c;
        }
      }
      else {
        pcVar3 = "0 == uv_random(NULL, NULL, buf, sizeof(buf), 0, NULL)";
        uStack_210 = 0x56;
      }
    }
    else {
      pcVar3 = "UV_E2BIG == uv_random(NULL, NULL, buf, -1, -1, NULL)";
      uStack_210 = 0x53;
    }
  }
  else {
    pcVar3 = "UV_EINVAL == uv_random(NULL, NULL, buf, sizeof(buf), -1, NULL)";
    uStack_210 = 0x52;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
          ,uStack_210,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(random_sync) {
  char zero[256];
  char buf[256];

  ASSERT(UV_EINVAL == uv_random(NULL, NULL, buf, sizeof(buf), -1, NULL));
  ASSERT(UV_E2BIG == uv_random(NULL, NULL, buf, -1, -1, NULL));

  memset(buf, 0, sizeof(buf));
  ASSERT(0 == uv_random(NULL, NULL, buf, sizeof(buf), 0, NULL));

  /* Buy a lottery ticket if you manage to trip this assertion. */
  memset(zero, 0, sizeof(zero));
  ASSERT(0 != memcmp(buf, zero, sizeof(zero)));

  MAKE_VALGRIND_HAPPY();
  return 0;
}